

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

ConstraintBlockSymbol *
slang::ast::ConstraintBlockSymbol::fromSyntax(Scope *scope,ConstraintPrototypeSyntax *syntax)

{
  short sVar1;
  Compilation *args;
  size_t sVar2;
  pointer ppCVar3;
  long lVar4;
  pointer pTVar5;
  Type *type;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  byte bVar6;
  ConstraintBlockSymbol *this;
  long lVar7;
  byte bVar8;
  ClassType *classType;
  SourceRange sourceRange;
  Token nameToken;
  SourceLocation local_50;
  Token local_48;
  string_view local_38;
  
  args = scope->compilation;
  local_48 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(syntax->name).ptr);
  local_38 = parsing::Token::valueText(&local_48);
  local_50 = parsing::Token::location(&local_48);
  this = BumpAllocator::
         emplace<slang::ast::ConstraintBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                   (&args->super_BumpAllocator,args,&local_38,&local_50);
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
  bVar6 = (this->flags).m_bits | 8;
  (this->flags).m_bits = bVar6;
  sVar2 = (syntax->specifiers).
          super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar2 != 0) {
    ppCVar3 = (syntax->specifiers).
              super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar7 = 0;
    do {
      lVar4 = *(long *)((long)ppCVar3 + lVar7);
      if ((*(byte *)(lVar4 + 0x2a) & 1) == 0) {
        sVar1 = *(short *)(lVar4 + 0x28);
        if (sVar1 == 0xc0) {
          bVar8 = 0x20;
        }
        else if (sVar1 == 0xa8) {
          bVar8 = 0x80;
        }
        else {
          bVar8 = 0x40;
        }
        bVar6 = bVar6 | bVar8;
        (this->flags).m_bits = bVar6;
      }
      lVar7 = lVar7 + 8;
    } while (sVar2 << 3 != lVar7);
  }
  sVar2 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar2 != 0) {
    pTVar5 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
    lVar7 = 0;
    do {
      sVar1 = *(short *)((long)&pTVar5->kind + lVar7);
      if (sVar1 == 0x11c) {
        bVar8 = 4;
LAB_003a9a3d:
        bVar6 = bVar6 | bVar8;
        (this->flags).m_bits = bVar6;
      }
      else {
        if (sVar1 == 0xf8) {
          bVar8 = 2;
          goto LAB_003a9a3d;
        }
        if (sVar1 == 0xa7) {
          bVar8 = 0x10;
          goto LAB_003a9a3d;
        }
      }
      lVar7 = lVar7 + 0x10;
    } while (sVar2 << 4 != lVar7);
  }
  type = (Type *)scope->thisSym;
  if ((type->super_Symbol).kind == ClassType) {
    if (((bVar6 & 2) != 0) && ((char)type[2].super_Symbol.kind == Unknown)) {
      sourceRange = parsing::Token::range(&local_48);
      Scope::addDiag(scope,(DiagCode)0xb20006,sourceRange);
      bVar6 = (this->flags).m_bits;
    }
    if ((bVar6 & 4) == 0) {
      addThisVar(this,type);
    }
  }
  return this;
}

Assistant:

ConstraintBlockSymbol& ConstraintBlockSymbol::fromSyntax(const Scope& scope,
                                                         const ConstraintPrototypeSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto nameToken = syntax.name->getLastToken();
    auto result = comp.emplace<ConstraintBlockSymbol>(comp, nameToken.valueText(),
                                                      nameToken.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->flags |= ConstraintBlockFlags::Extern;

    addSpecifierFlags(syntax.specifiers, result->flags);

    for (auto qual : syntax.qualifiers) {
        switch (qual.kind) {
            case TokenKind::StaticKeyword:
                result->flags |= ConstraintBlockFlags::Static;
                break;
            case TokenKind::ExternKeyword:
                result->flags |= ConstraintBlockFlags::ExplicitExtern;
                break;
            case TokenKind::PureKeyword:
                result->flags |= ConstraintBlockFlags::Pure;
                break;
            default:
                break;
        }
    }

    if (scope.asSymbol().kind == SymbolKind::ClassType) {
        auto& classType = scope.asSymbol().as<ClassType>();
        if (result->flags.has(ConstraintBlockFlags::Pure) && !classType.isAbstract)
            scope.addDiag(diag::PureConstraintInAbstract, nameToken.range());

        if (!result->flags.has(ConstraintBlockFlags::Static))
            result->addThisVar(classType);
    }

    return *result;
}